

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void COVER_best_wait(COVER_best_t *best)

{
  if (best != (COVER_best_t *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)best);
    if (best->liveJobs != 0) {
      do {
        pthread_cond_wait((pthread_cond_t *)&best->cond,(pthread_mutex_t *)best);
      } while (best->liveJobs != 0);
    }
    pthread_mutex_unlock((pthread_mutex_t *)best);
    return;
  }
  return;
}

Assistant:

void COVER_best_wait(COVER_best_t *best) {
  if (!best) {
    return;
  }
  ZSTD_pthread_mutex_lock(&best->mutex);
  while (best->liveJobs != 0) {
    ZSTD_pthread_cond_wait(&best->cond, &best->mutex);
  }
  ZSTD_pthread_mutex_unlock(&best->mutex);
}